

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O3

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t __n;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *__data;
  pointer pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar2 = &local_b8.field_2;
  uVar7 = 0;
  local_58 = __return_storage_ptr__;
  do {
    pcVar9 = (input->_M_dataplus)._M_p;
    __n = input->_M_string_length - uVar7;
    if (input->_M_string_length < uVar7 || __n == 0) goto LAB_0015bd8a;
    pvVar3 = memchr(pcVar9 + uVar7,10,__n);
    lVar6 = (long)pvVar3 - (long)pcVar9;
    if (lVar6 == -1 || pvVar3 == (void *)0x0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,input,0,lVar6 + 1U);
    pbVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50,(leader->_M_dataplus)._M_p,leader->_M_string_length);
    local_b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar5) {
      local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_b8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_b8._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_98,input,lVar6 + 1U,0xffffffffffffffff);
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      uVar8 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_98._M_string_length + local_b8._M_string_length) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar8 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_98._M_string_length + local_b8._M_string_length) goto LAB_0015bcaa;
      pbVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_98,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    }
    else {
LAB_0015bcaa:
      pbVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_b8,local_98._M_dataplus._M_p,local_98._M_string_length);
    }
    local_78._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar5) {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    paVar5->_M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (input,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar7 = lVar6 + leader->_M_string_length;
  } while (uVar7 != 0xffffffffffffffff);
  pcVar9 = (input->_M_dataplus)._M_p;
LAB_0015bd8a:
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  paVar1 = &input->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar9 == paVar1) {
    uVar8 = *(undefined8 *)((long)&input->field_2 + 8);
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_58->field_2 + 8) = uVar8;
  }
  else {
    (local_58->_M_dataplus)._M_p = pcVar9;
    (local_58->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_58->_M_string_length = input->_M_string_length;
  (input->_M_dataplus)._M_p = (pointer)paVar1;
  input->_M_string_length = 0;
  (input->field_2)._M_local_buf[0] = '\0';
  return local_58;
}

Assistant:

inline std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}